

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_186c9d3::HandleRegexCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  cmExecutionStatus *pcVar5;
  _Alloc_hider _Var6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  int iVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pbVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  char *pcVar18;
  string_view value;
  string_view value_00;
  string_view value_01;
  string output;
  string e_2;
  string input;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  undefined1 local_340 [32];
  cmExecutionStatus *local_320;
  pointer local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  cmStringReplaceHelper local_2e8;
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x21) {
    local_2e8.ErrorString._M_dataplus._M_p = (pointer)&local_2e8.ErrorString.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,"sub-command REGEX requires a mode to be specified.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    pbVar17 = pbVar14 + 1;
    iVar10 = std::__cxx11::string::compare((char *)pbVar17);
    if (iVar10 == 0) {
      pbVar14 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (0x80 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14)) {
        cmMakefile::ClearMatches(status->Makefile);
        local_2e8.RegularExpression.regmatch.endp[0x1a] = (char *)0x0;
        local_2e8.RegularExpression.regmatch.endp[0x1c] = (char *)0x0;
        local_2e8.RegularExpression.regmatch.endp[0x1d]._0_4_ = 0;
        memset(&local_2e8,0,0x20a);
        bVar9 = cmsys::RegularExpression::compile
                          ((RegularExpression *)&local_2e8,pbVar14[2]._M_dataplus._M_p);
        if (!bVar9) {
          std::operator+(&local_3a0,"sub-command REGEX, mode MATCH failed to compile regex \"",
                         pbVar14 + 2);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_3a0);
          local_360._M_allocated_capacity = (size_type)&local_350;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar12) {
            local_350._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_350._8_8_ = plVar11[3];
          }
          else {
            local_350._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_360._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar11;
          }
          local_360._8_8_ = plVar11[1];
          *plVar11 = (long)paVar12;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00434a27;
        }
        local_380._8_8_ =
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        local_380._M_allocated_capacity =
             (size_type)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 4);
        paVar12 = &local_3a0.field_2;
        local_3a0._M_string_length = 0;
        local_3a0.field_2._M_allocated_capacity =
             local_3a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = paVar12;
        local_3a0._M_dataplus._M_p = (pointer)paVar12;
        cmJoin((string *)&local_360,(cmStringRange *)&local_380,(string_view)(auVar2 << 0x40),
               (string_view)ZEXT816(0));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != paVar12) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        local_3a0._M_string_length = 0;
        local_3a0.field_2._M_allocated_capacity =
             local_3a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_3a0._M_dataplus._M_p = (pointer)paVar12;
        bVar9 = cmsys::RegularExpression::find
                          ((RegularExpression *)&local_2e8,(char *)local_360._M_allocated_capacity,
                           (RegularExpressionMatch *)&local_2e8);
        if (bVar9) {
          cmMakefile::StoreMatches(status->Makefile,(RegularExpression *)&local_2e8);
          if (local_2e8.RegularExpression.regmatch.startp[0x18] !=
              local_2e8.ErrorString._M_dataplus._M_p) {
            std::__cxx11::string::substr((ulong)&local_380,(ulong)&local_360);
            std::__cxx11::string::operator=((string *)&local_3a0,(string *)local_380._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_allocated_capacity != &local_370) {
              operator_delete((void *)local_380._M_allocated_capacity,
                              local_370._M_allocated_capacity + 1);
            }
            goto LAB_00434482;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_340,"sub-command REGEX, mode MATCH regex \"",pbVar14 + 2);
          plVar11 = (long *)std::__cxx11::string::append(local_340);
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar13) {
            local_370._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_370._8_8_ = plVar11[3];
            local_380._M_allocated_capacity = (size_type)&local_370;
          }
          else {
            local_370._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_380._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar11;
          }
          local_380._8_8_ = plVar11[1];
          *plVar11 = (long)paVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((pointer)local_340._0_8_ != (pointer)(local_340 + 0x10)) {
            operator_delete((void *)local_340._0_8_,(ulong)(local_340._16_8_ + 1));
          }
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_allocated_capacity != &local_370) {
            operator_delete((void *)local_380._M_allocated_capacity,
                            local_370._M_allocated_capacity + 1);
          }
          bVar9 = false;
        }
        else {
LAB_00434482:
          bVar9 = true;
          value._M_str = local_3a0._M_dataplus._M_p;
          value._M_len = local_3a0._M_string_length;
          cmMakefile::AddDefinition(status->Makefile,pbVar14 + 3,value);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != paVar12) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_allocated_capacity != &local_350) {
          operator_delete((void *)local_360._M_allocated_capacity,
                          local_350._M_allocated_capacity + 1);
        }
LAB_00434c43:
        if (local_2e8.RegularExpression.regmatch.endp[0x1c] != (char *)0x0) {
          operator_delete__(local_2e8.RegularExpression.regmatch.endp[0x1c]);
        }
        return bVar9;
      }
      local_2e8.ErrorString._M_dataplus._M_p = (pointer)&local_2e8.ErrorString.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2e8,
                 "sub-command REGEX, mode MATCH needs at least 5 arguments total to command.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      iVar10 = std::__cxx11::string::compare((char *)pbVar17);
      local_320 = status;
      if (iVar10 == 0) {
        pbVar14 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (0x80 < (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14)) {
          cmMakefile::ClearMatches(status->Makefile);
          local_2e8.RegularExpression.regmatch.endp[0x1a] = (char *)0x0;
          local_2e8.RegularExpression.regmatch.endp[0x1c] = (char *)0x0;
          local_2e8.RegularExpression.regmatch.endp[0x1d]._0_4_ = 0;
          memset(&local_2e8,0,0x20a);
          bVar9 = cmsys::RegularExpression::compile
                            ((RegularExpression *)&local_2e8,pbVar14[2]._M_dataplus._M_p);
          pbVar17 = pbVar14 + 2;
          if (bVar9) {
            local_380._8_8_ =
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            local_380._M_allocated_capacity =
                 (size_type)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 4);
            paVar12 = &local_3a0.field_2;
            local_3a0._M_string_length = 0;
            local_3a0.field_2._M_allocated_capacity =
                 local_3a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = paVar12;
            local_3a0._M_dataplus._M_p = (pointer)paVar12;
            local_318 = pbVar14;
            cmJoin((string *)&local_360,(cmStringRange *)&local_380,(string_view)(auVar3 << 0x40),
                   (string_view)ZEXT816(0));
            local_310 = pbVar17;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != paVar12) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
            local_318 = local_318 + 3;
            local_3a0._M_string_length = 0;
            local_3a0.field_2._M_allocated_capacity =
                 local_3a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            uVar16 = local_360._M_allocated_capacity;
            local_3a0._M_dataplus._M_p = (pointer)paVar12;
            while( true ) {
              bVar9 = cmsys::RegularExpression::find
                                ((RegularExpression *)&local_2e8,(char *)uVar16,
                                 (RegularExpressionMatch *)&local_2e8);
              if (!bVar9) break;
              cmMakefile::ClearMatches(status->Makefile);
              cmMakefile::StoreMatches(status->Makefile,(RegularExpression *)&local_2e8);
              pcVar8 = local_2e8.RegularExpression.regmatch.endp[0x18];
              pcVar7 = local_2e8.RegularExpression.regmatch.startp[0x18];
              _Var6._M_p = local_2e8.ErrorString._M_dataplus._M_p;
              if (local_2e8.RegularExpression.regmatch.startp[0x18] ==
                  local_2e8.ErrorString._M_dataplus._M_p) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_340,"sub-command REGEX, mode MATCHALL regex \"",local_310);
                plVar11 = (long *)std::__cxx11::string::append(local_340);
                pcVar5 = local_320;
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 == paVar12) {
                  local_370._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_370._8_8_ = plVar11[3];
                  local_380._M_allocated_capacity = (size_type)&local_370;
                }
                else {
                  local_370._M_allocated_capacity = paVar12->_M_allocated_capacity;
                  local_380._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar11;
                }
                local_380._8_8_ = plVar11[1];
                *plVar11 = (long)paVar12;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                if ((pointer)local_340._0_8_ != (pointer)(local_340 + 0x10)) {
                  operator_delete((void *)local_340._0_8_,(ulong)(local_340._16_8_ + 1));
                }
                std::__cxx11::string::_M_assign((string *)&pcVar5->Error);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_380._M_allocated_capacity != &local_370) {
                  operator_delete((void *)local_380._M_allocated_capacity,
                                  local_370._M_allocated_capacity + 1);
                }
                goto LAB_00434c0d;
              }
              if (local_3a0._M_string_length != 0) {
                std::__cxx11::string::append((char *)&local_3a0);
              }
              pcVar18 = (char *)(uVar16 + ((long)_Var6._M_p - (long)pcVar8));
              uVar16 = uVar16 + ((long)pcVar7 - (long)pcVar8);
              local_380._M_allocated_capacity = (size_type)&local_370;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,pcVar18,uVar16);
              std::__cxx11::string::_M_append((char *)&local_3a0,local_380._M_allocated_capacity);
              status = local_320;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_allocated_capacity != &local_370) {
                operator_delete((void *)local_380._M_allocated_capacity,
                                local_370._M_allocated_capacity + 1);
              }
            }
            value_01._M_str = local_3a0._M_dataplus._M_p;
            value_01._M_len = local_3a0._M_string_length;
            cmMakefile::AddDefinition(status->Makefile,local_318,value_01);
LAB_00434c0d:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_allocated_capacity != &local_350) {
              operator_delete((void *)local_360._M_allocated_capacity,
                              local_350._M_allocated_capacity + 1);
            }
            bVar9 = !bVar9;
            goto LAB_00434c43;
          }
          std::operator+(&local_3a0,"sub-command REGEX, mode MATCHALL failed to compile regex \"",
                         pbVar17);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_3a0);
          local_360._M_allocated_capacity = (size_type)&local_350;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar12) {
            local_350._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_350._8_8_ = plVar11[3];
          }
          else {
            local_350._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_360._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar11;
          }
          local_360._8_8_ = plVar11[1];
          *plVar11 = (long)paVar12;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00434a27:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_allocated_capacity != &local_350) {
            operator_delete((void *)local_360._M_allocated_capacity,
                            local_350._M_allocated_capacity + 1);
          }
          bVar9 = false;
          goto LAB_00434c43;
        }
        local_2e8.ErrorString._M_dataplus._M_p = (pointer)&local_2e8.ErrorString.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e8,
                   "sub-command REGEX, mode MATCHALL needs at least 5 arguments total to command.",
                   "");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)pbVar17);
        if (iVar10 != 0) {
          std::operator+(&local_2e8.ErrorString,"sub-command REGEX does not recognize mode ",pbVar17
                        );
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8.ErrorString._M_dataplus._M_p == &local_2e8.ErrorString.field_2) {
            return false;
          }
          goto LAB_004341d5;
        }
        pbVar14 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (0xbf < (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14)) {
          pcVar1 = pbVar14[3]._M_dataplus._M_p;
          local_360._M_allocated_capacity = (size_type)&local_350;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_360,pcVar1,pcVar1 + pbVar14[3]._M_string_length);
          cmStringReplaceHelper::cmStringReplaceHelper
                    (&local_2e8,pbVar14 + 2,(string *)&local_360,status->Makefile);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_allocated_capacity != &local_350) {
            operator_delete((void *)local_360._M_allocated_capacity,
                            local_350._M_allocated_capacity + 1);
          }
          pcVar5 = local_320;
          if (local_2e8.ValidReplaceExpression == false) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_380,"sub-command REGEX, mode REPLACE: ",&local_2e8.ErrorString);
            plVar11 = (long *)std::__cxx11::string::append(local_380._M_local_buf);
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 == paVar12) {
              local_3a0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_3a0.field_2._8_8_ = plVar11[3];
              local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
            }
            else {
              local_3a0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_3a0._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_3a0._M_string_length = plVar11[1];
            *plVar11 = (long)paVar12;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::__cxx11::string::_M_assign((string *)&pcVar5->Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
              operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1
                             );
            }
            uVar16 = local_370._M_allocated_capacity;
            uVar15 = local_380._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_allocated_capacity != &local_370) {
LAB_00434d21:
              operator_delete((void *)uVar15,uVar16 + 1);
            }
          }
          else {
            cmMakefile::ClearMatches(local_320->Makefile);
            if (local_2e8.RegularExpression.program != (char *)0x0) {
              local_340._0_8_ =
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 5;
              local_340._8_8_ =
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              local_380._8_8_ = 0;
              local_370._M_allocated_capacity = local_370._M_allocated_capacity & 0xffffffffffffff00
              ;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = &local_370;
              local_380._M_allocated_capacity = (size_type)&local_370;
              cmJoin(&local_3a0,(cmStringRange *)local_340,(string_view)(auVar4 << 0x40),
                     (string_view)ZEXT816(0));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_allocated_capacity != &local_370) {
                operator_delete((void *)local_380._M_allocated_capacity,
                                local_370._M_allocated_capacity + 1);
              }
              local_380._8_8_ = (pointer)0x0;
              local_370._M_allocated_capacity = local_370._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_380._M_allocated_capacity = (size_type)&local_370;
              bVar9 = cmStringReplaceHelper::Replace(&local_2e8,&local_3a0,(string *)&local_380);
              if (bVar9) {
                value_00._M_str = (char *)local_380._M_allocated_capacity;
                value_00._M_len = local_380._8_8_;
                cmMakefile::AddDefinition(pcVar5->Makefile,pbVar14 + 4,value_00);
              }
              else {
                std::operator+(&local_308,"sub-command REGEX, mode REPLACE: ",&local_2e8.ErrorString
                              );
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_308);
                pbVar14 = (pointer)(plVar11 + 2);
                if ((pointer)*plVar11 == pbVar14) {
                  local_340._16_8_ = (pbVar14->_M_dataplus)._M_p;
                  local_340._24_8_ = plVar11[3];
                  local_340._0_8_ = (pointer)(local_340 + 0x10);
                }
                else {
                  local_340._16_8_ = (pbVar14->_M_dataplus)._M_p;
                  local_340._0_8_ = (pointer)*plVar11;
                }
                local_340._8_8_ = plVar11[1];
                *plVar11 = (long)pbVar14;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::__cxx11::string::_M_assign((string *)&pcVar5->Error);
                if ((pointer)local_340._0_8_ != (pointer)(local_340 + 0x10)) {
                  operator_delete((void *)local_340._0_8_,(ulong)(local_340._16_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p != &local_308.field_2) {
                  operator_delete(local_308._M_dataplus._M_p,
                                  local_308.field_2._M_allocated_capacity + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_allocated_capacity != &local_370) {
                operator_delete((void *)local_380._M_allocated_capacity,
                                local_370._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                operator_delete(local_3a0._M_dataplus._M_p,
                                local_3a0.field_2._M_allocated_capacity + 1);
              }
              goto LAB_00434dc9;
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_380,"sub-command REGEX, mode REPLACE failed to compile regex \"",
                           pbVar14 + 2);
            plVar11 = (long *)std::__cxx11::string::append(local_380._M_local_buf);
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 == paVar12) {
              local_3a0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_3a0.field_2._8_8_ = plVar11[3];
              local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
            }
            else {
              local_3a0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
              local_3a0._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_3a0._M_string_length = plVar11[1];
            *plVar11 = (long)paVar12;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_380._M_allocated_capacity != &local_370) {
              operator_delete((void *)local_380._M_allocated_capacity,
                              local_370._M_allocated_capacity + 1);
            }
            std::__cxx11::string::_M_assign((string *)&pcVar5->Error);
            uVar16 = local_3a0.field_2._M_allocated_capacity;
            uVar15 = local_3a0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) goto LAB_00434d21;
          }
          bVar9 = false;
LAB_00434dc9:
          std::
          vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
          ::~vector(&local_2e8.Replacements);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8.ReplaceExpression._M_dataplus._M_p !=
              &local_2e8.ReplaceExpression.field_2) {
            operator_delete(local_2e8.ReplaceExpression._M_dataplus._M_p,
                            local_2e8.ReplaceExpression.field_2._M_allocated_capacity + 1);
          }
          if (local_2e8.RegularExpression.program != (char *)0x0) {
            operator_delete__(local_2e8.RegularExpression.program);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8.RegExString._M_dataplus._M_p != &local_2e8.RegExString.field_2) {
            operator_delete(local_2e8.RegExString._M_dataplus._M_p,
                            local_2e8.RegExString.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8.ErrorString._M_dataplus._M_p != &local_2e8.ErrorString.field_2) {
            operator_delete(local_2e8.ErrorString._M_dataplus._M_p,
                            local_2e8.ErrorString.field_2._M_allocated_capacity + 1);
            return bVar9;
          }
          return bVar9;
        }
        local_2e8.ErrorString._M_dataplus._M_p = (pointer)&local_2e8.ErrorString.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2e8,
                   "sub-command REGEX, mode REPLACE needs at least 6 arguments total to command.",""
                  );
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8.ErrorString._M_dataplus._M_p == &local_2e8.ErrorString.field_2) {
    return false;
  }
LAB_004341d5:
  operator_delete(local_2e8.ErrorString._M_dataplus._M_p,
                  local_2e8.ErrorString.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool HandleRegexCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command REGEX requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if (mode == "MATCH") {
    if (args.size() < 5) {
      status.SetError("sub-command REGEX, mode MATCH needs "
                      "at least 5 arguments total to command.");
      return false;
    }
    return RegexMatch(args, status);
  }
  if (mode == "MATCHALL") {
    if (args.size() < 5) {
      status.SetError("sub-command REGEX, mode MATCHALL needs "
                      "at least 5 arguments total to command.");
      return false;
    }
    return RegexMatchAll(args, status);
  }
  if (mode == "REPLACE") {
    if (args.size() < 6) {
      status.SetError("sub-command REGEX, mode REPLACE needs "
                      "at least 6 arguments total to command.");
      return false;
    }
    return RegexReplace(args, status);
  }

  std::string e = "sub-command REGEX does not recognize mode " + mode;
  status.SetError(e);
  return false;
}